

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  function<void_(int,_diy::Bounds<double>,_diy::Bounds<double>,_diy::Bounds<double>,_diy::RegularLink<diy::Bounds<double>_>)>
  *this;
  reference pdVar5;
  function<void_(void_*,_diy::BinaryBuffer_&)> *this_00;
  ContiguousAssigner read_assigner;
  Master read_master;
  Decomposer decomposer;
  int i;
  Bounds dom_bounds;
  ContiguousAssigner assigner;
  Master master;
  FileStorage storage;
  Options ops;
  bool help;
  int nvals;
  int dom_dim;
  int num_threads;
  int mem_blocks;
  int tot_blocks;
  communicator world;
  environment env;
  unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *in_stack_ffffffffffffca38;
  undefined1 *i_00;
  string *position_;
  undefined8 uVar6;
  Master *in_stack_ffffffffffffca40;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this_01;
  MemoryBuffer *this_02;
  _func_void_void_ptr_BinaryBuffer_ptr **in_stack_ffffffffffffca48;
  NeverSkip *pNVar7;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffca50;
  undefined8 in_stack_ffffffffffffca58;
  Bounds<double> *in_stack_ffffffffffffca60;
  bool *in_stack_ffffffffffffca68;
  string *in_stack_ffffffffffffca70;
  Skip *s;
  undefined4 in_stack_ffffffffffffca78;
  undefined4 in_stack_ffffffffffffca7c;
  Master *in_stack_ffffffffffffca80;
  Master *this_03;
  Options *in_stack_ffffffffffffca88;
  FILE *f;
  undefined4 in_stack_ffffffffffffca90;
  undefined4 in_stack_ffffffffffffca94;
  BoolVector *in_stack_ffffffffffffca98;
  string *in_stack_ffffffffffffcaa0;
  int *in_stack_ffffffffffffcaa8;
  Bounds *in_stack_ffffffffffffcab0;
  undefined8 in_stack_ffffffffffffcab8;
  RegularDecomposer<diy::Bounds<double>_> *in_stack_ffffffffffffcac0;
  undefined4 in_stack_ffffffffffffcad0;
  undefined4 in_stack_ffffffffffffcad4;
  Master *master_00;
  StaticAssigner *assigner_00;
  MemoryBuffer *comm;
  string *infilename;
  FILE local_33d1;
  string local_33d0 [48];
  NeverSkip local_33a0 [64];
  code *local_3360;
  code *local_3338;
  communicator local_3310 [8];
  SaveBlock *in_stack_ffffffffffffcdb0;
  MemoryBuffer *in_stack_ffffffffffffcdb8;
  Master *in_stack_ffffffffffffcdc0;
  _Base_ptr in_stack_ffffffffffffcdc8;
  _Base_ptr in_stack_ffffffffffffcdd0;
  char **in_stack_ffffffffffffcf00;
  int in_stack_ffffffffffffcf0c;
  Options *in_stack_ffffffffffffcf10;
  Creator *in_stack_ffffffffffffd4f8;
  StaticAssigner *in_stack_ffffffffffffd500;
  int in_stack_ffffffffffffd50c;
  RegularDecomposer<diy::Bounds<double>_> *in_stack_ffffffffffffd510;
  allocator<char> local_1c59;
  string local_1c58 [72];
  code *local_1c10;
  undefined8 local_1c08;
  undefined4 *local_1bd8;
  undefined1 *local_1bd0;
  undefined1 local_1ba8 [32];
  string local_1b88;
  Master *local_1b68;
  StaticAssigner *pSStack_1b60;
  Master *local_1b58;
  StaticAssigner *pSStack_1b50;
  undefined8 local_1b48;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  int local_19dc;
  code *local_1928;
  NeverSkip local_1920 [32];
  code *local_1900;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> local_18f8;
  communicator local_1888;
  undefined1 local_1870 [2864];
  DestroyBlock *in_stack_fffffffffffff2c0;
  CreateBlock *in_stack_fffffffffffff2c8;
  int in_stack_fffffffffffff2d0;
  int in_stack_fffffffffffff2d4;
  communicator *in_stack_fffffffffffff2d8;
  Master *in_stack_fffffffffffff2e0;
  ExternalStorage *in_stack_fffffffffffff2f0;
  SaveBlock *in_stack_fffffffffffff2f8;
  LoadBlock *in_stack_fffffffffffff300;
  QueuePolicy *in_stack_fffffffffffff308;
  allocator<char> local_239;
  string local_238 [32];
  undefined1 local_218 [128];
  undefined4 local_198;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [47];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [47];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [103];
  byte local_51;
  undefined4 local_50;
  int local_4c;
  undefined4 local_48;
  undefined4 local_44;
  int local_40;
  communicator local_30;
  int local_4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffca58 >> 0x20);
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffca40,
             (int)((ulong)in_stack_ffffffffffffca38 >> 0x20),(char **)0x1123bd);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffca40);
  local_40 = diy::mpi::communicator::size(&local_30);
  local_44 = 0xffffffff;
  local_48 = 1;
  local_4c = 3;
  local_50 = 100;
  opts::Options::Options((Options *)in_stack_ffffffffffffca40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffca80,
             (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
             (allocator<char> *)in_stack_ffffffffffffca70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffca80,
             (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
             (allocator<char> *)in_stack_ffffffffffffca70);
  opts::Option<int>((char)((ulong)in_stack_ffffffffffffcab8 >> 0x38),
                    (string *)in_stack_ffffffffffffcab0,in_stack_ffffffffffffcaa8,
                    in_stack_ffffffffffffcaa0);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffca40,in_stack_ffffffffffffca38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffca80,
             (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
             (allocator<char> *)in_stack_ffffffffffffca70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffca80,
             (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
             (allocator<char> *)in_stack_ffffffffffffca70);
  opts::Option<int>((char)((ulong)in_stack_ffffffffffffcab8 >> 0x38),
                    (string *)in_stack_ffffffffffffcab0,in_stack_ffffffffffffcaa8,
                    in_stack_ffffffffffffcaa0);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffca40,in_stack_ffffffffffffca38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffca80,
             (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
             (allocator<char> *)in_stack_ffffffffffffca70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffca80,
             (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
             (allocator<char> *)in_stack_ffffffffffffca70);
  opts::Option<bool>((char)((uint)in_stack_ffffffffffffca7c >> 0x18),in_stack_ffffffffffffca70,
                     in_stack_ffffffffffffca68,(string *)in_stack_ffffffffffffca60);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffca40,in_stack_ffffffffffffca38);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffca40);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffca40);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffca40);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  bVar1 = opts::Options::parse
                    (in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf0c,in_stack_ffffffffffffcf00);
  if ((bVar1) && ((local_51 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffca80,
               (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
               (allocator<char> *)in_stack_ffffffffffffca70);
    diy::FileStorage::FileStorage
              ((FileStorage *)CONCAT44(in_stack_ffffffffffffca94,in_stack_ffffffffffffca90),
               (string *)in_stack_ffffffffffffca88);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
    diy::mpi::communicator::communicator(&local_1888,&local_30);
    local_18f8.m_dynamic_data = (pointer)Block::create;
    std::function<void*()>::function<void*(*)(),void>
              ((function<void_*()> *)in_stack_ffffffffffffca50,
               (_func_void_ptr **)in_stack_ffffffffffffca48);
    local_18f8.m_static_data[0] = (type)Block::destroy;
    std::function<void(void*)>::function<void(*)(void*),void>
              ((function<void_(void_*)> *)in_stack_ffffffffffffca50,
               (_func_void_void_ptr **)in_stack_ffffffffffffca48);
    local_1900 = Block::save;
    std::function<void(void_const*,diy::BinaryBuffer&)>::
    function<void(*)(void_const*,diy::BinaryBuffer&),void>
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffca50,
               in_stack_ffffffffffffca48);
    local_1928 = Block::load;
    std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
              (in_stack_ffffffffffffca50,in_stack_ffffffffffffca48);
    this = (function<void_(int,_diy::Bounds<double>,_diy::Bounds<double>,_diy::Bounds<double>,_diy::RegularLink<diy::Bounds<double>_>)>
            *)operator_new(0x10);
    diy::Master::QueueSizePolicy::QueueSizePolicy
              ((QueueSizePolicy *)in_stack_ffffffffffffca40,(size_t)in_stack_ffffffffffffca38);
    pNVar7 = local_1920;
    this_01 = &local_18f8;
    i_00 = local_218;
    diy::Master::Master(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,
                        in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0,
                        in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
                        in_stack_fffffffffffff2f0,in_stack_fffffffffffff2f8,
                        in_stack_fffffffffffff300,in_stack_fffffffffffff308);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x112b89);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x112b96);
    std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x112ba3);
    std::function<void_*()>::~function((function<void_*()> *)0x112bb0);
    diy::mpi::communicator::~communicator((communicator *)0x112bbd);
    diy::mpi::communicator::size(&local_30);
    diy::ContiguousAssigner::Assigner
              ((ContiguousAssigner *)this_01,(int)((ulong)i_00 >> 0x20),(int)i_00);
    diy::Bounds<double>::Bounds(in_stack_ffffffffffffca60,iVar2);
    local_19dc = 0;
    while( true ) {
      iVar3 = (int)((ulong)in_stack_ffffffffffffcab8 >> 0x20);
      iVar2 = (int)((ulong)in_stack_ffffffffffffcaa8 >> 0x20);
      if (local_4c <= local_19dc) break;
      pdVar5 = itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::operator[]
                         (this_01,(size_type)i_00);
      *pdVar5 = -1.0;
      pdVar5 = itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::operator[]
                         (this_01,(size_type)i_00);
      *pdVar5 = 1.0;
      local_19dc = local_19dc + 1;
    }
    master_00 = (Master *)0x0;
    assigner_00 = (StaticAssigner *)0x0;
    local_1b28 = 0;
    uStack_1b20 = 0;
    local_1b38 = 0;
    uStack_1b30 = 0;
    local_1b18 = 0;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x112e29);
    local_1b48 = 0;
    local_1b68 = master_00;
    pSStack_1b60 = assigner_00;
    local_1b58 = master_00;
    pSStack_1b50 = assigner_00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x112e62);
    local_1b88.field_2._M_allocated_capacity = 0;
    position_ = &local_1b88;
    local_1b88._0_8_ = master_00;
    local_1b88._M_string_length = (size_type)assigner_00;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x112e93);
    local_1ba8._16_8_ = 0;
    this_02 = (MemoryBuffer *)local_1ba8;
    local_1ba8._0_8_ = master_00;
    local_1ba8._8_8_ = assigner_00;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x112ec4);
    comm = this_02;
    infilename = position_;
    diy::RegularDecomposer<diy::Bounds<double>_>::RegularDecomposer
              (in_stack_ffffffffffffcac0,iVar3,in_stack_ffffffffffffcab0,iVar2,
               (BoolVector *)in_stack_ffffffffffffcaa0,in_stack_ffffffffffffca98,
               (CoordinateVector *)CONCAT44(in_stack_ffffffffffffcad4,in_stack_ffffffffffffcad0),
               (DivisionsVector *)master_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)this);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x112f3a);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x112f47);
    iVar2 = diy::mpi::communicator::rank(&local_30);
    local_1bd0 = local_1870;
    std::
    function<void(int,diy::Bounds<double>,diy::Bounds<double>,diy::Bounds<double>,diy::RegularLink<diy::Bounds<double>>)>
    ::function<main::__0,void>(this,(anon_class_8_1_60b11ba0 *)pNVar7);
    diy::RegularDecomposer<diy::Bounds<double>_>::decompose
              (in_stack_ffffffffffffd510,in_stack_ffffffffffffd50c,in_stack_ffffffffffffd500,
               in_stack_ffffffffffffd4f8);
    std::
    function<void_(int,_diy::Bounds<double>,_diy::Bounds<double>,_diy::Bounds<double>,_diy::RegularLink<diy::Bounds<double>_>)>
    ::~function((function<void_(int,_diy::Bounds<double>,_diy::Bounds<double>,_diy::Bounds<double>,_diy::RegularLink<diy::Bounds<double>_>)>
                 *)0x112fbd);
    local_1bd8 = &local_50;
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
              ((function<bool_(int,_const_diy::Master_&)> *)this,pNVar7);
    diy::Master::foreach<main::__1>
              (in_stack_ffffffffffffca80,
               (anon_class_8_1_a85f2600 *)
               CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
               (Skip *)in_stack_ffffffffffffca70);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x113016);
    local_1c10 = Block::print_data;
    local_1c08 = 0;
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
              ((function<bool_(int,_const_diy::Master_&)> *)this,pNVar7);
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              (in_stack_ffffffffffffca80,
               (offset_in_Block_to_subr *)
               CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
               (Skip *)in_stack_ffffffffffffca70);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x11307a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffca80,
               (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
               (allocator<char> *)in_stack_ffffffffffffca70);
    diy::MemoryBuffer::MemoryBuffer(this_02,(size_t)position_);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)this_02,position_);
    diy::io::write_blocks
              ((string *)in_stack_ffffffffffffcdd0,(communicator *)in_stack_ffffffffffffcdc8,
               in_stack_ffffffffffffcdc0,in_stack_ffffffffffffcdb8,in_stack_ffffffffffffcdb0);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x113109);
    diy::MemoryBuffer::~MemoryBuffer(this_02);
    std::__cxx11::string::~string(local_1c58);
    std::allocator<char>::~allocator(&local_1c59);
    diy::mpi::communicator::communicator(local_3310,&local_30);
    local_3338 = Block::create;
    std::function<void*()>::function<void*(*)(),void>
              ((function<void_*()> *)this,(_func_void_ptr **)pNVar7);
    local_3360 = Block::destroy;
    std::function<void(void*)>::function<void(*)(void*),void>
              ((function<void_(void_*)> *)this,(_func_void_void_ptr **)pNVar7);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)this_02,position_);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)this_02,position_);
    this_00 = (function<void_(void_*,_diy::BinaryBuffer_&)> *)operator_new(0x10);
    diy::Master::QueueSizePolicy::QueueSizePolicy((QueueSizePolicy *)this_02,(size_t)position_);
    pNVar7 = local_33a0;
    in_stack_ffffffffffffca40 = (Master *)(local_33a0 + 0x20);
    uVar6 = 0;
    diy::Master::Master(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,
                        in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0,
                        in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
                        in_stack_fffffffffffff2f0,in_stack_fffffffffffff2f8,
                        in_stack_fffffffffffff300,in_stack_fffffffffffff308);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x113242);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x11324f);
    std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x11325c);
    std::function<void_*()>::~function((function<void_*()> *)0x113269);
    diy::mpi::communicator::~communicator((communicator *)0x113276);
    iVar3 = diy::mpi::communicator::size(&local_30);
    diy::ContiguousAssigner::Assigner
              ((ContiguousAssigner *)in_stack_ffffffffffffca40,(int)((ulong)uVar6 >> 0x20),
               (int)uVar6);
    f = &local_33d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffca80,
               (char *)CONCAT44(in_stack_ffffffffffffca7c,in_stack_ffffffffffffca78),
               (allocator<char> *)in_stack_ffffffffffffca70);
    this_03 = (Master *)&stack0xffffffffffffcc08;
    std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
              (this_00,(_func_void_void_ptr_BinaryBuffer_ptr **)pNVar7);
    diy::io::read_blocks
              (infilename,(communicator *)comm,assigner_00,master_00,
               (LoadBlock *)CONCAT44(iVar2,in_stack_ffffffffffffcad0));
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x113330);
    std::__cxx11::string::~string(local_33d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_33d1);
    s = _stderr;
    uVar4 = diy::Master::size((Master *)0x113366);
    fmt::v7::print<char[26],unsigned_int,char>
              (f,(char (*) [26])this_03,(uint *)CONCAT44(uVar4,in_stack_ffffffffffffca78));
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
              ((function<bool_(int,_const_diy::Master_&)> *)this_00,pNVar7);
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              (this_03,(offset_in_Block_to_subr *)CONCAT44(uVar4,in_stack_ffffffffffffca78),s);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x1133f0);
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
              ((function<bool_(int,_const_diy::Master_&)> *)this_00,pNVar7);
    diy::Master::foreach<main::__2>
              (this_03,(anon_class_16_2_0ccd6fd4 *)CONCAT44(uVar4,in_stack_ffffffffffffca78),s);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x113455);
    diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x113462);
    diy::Master::~Master(in_stack_ffffffffffffca40);
    diy::RegularDecomposer<diy::Bounds<double>_>::~RegularDecomposer
              ((RegularDecomposer<diy::Bounds<double>_> *)in_stack_ffffffffffffca40);
    diy::Bounds<double>::~Bounds((Bounds<double> *)in_stack_ffffffffffffca40);
    diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x113496);
    diy::Master::~Master(in_stack_ffffffffffffca40);
    diy::FileStorage::~FileStorage((FileStorage *)CONCAT44(iVar3,in_stack_ffffffffffffca90));
    local_198 = 0;
  }
  else {
    iVar2 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == 0) {
      opts::operator<<((ostream *)CONCAT44(in_stack_ffffffffffffca94,in_stack_ffffffffffffca90),
                       in_stack_ffffffffffffca88);
    }
    local_4 = 1;
    local_198 = 1;
  }
  opts::Options::~Options((Options *)in_stack_ffffffffffffca40);
  diy::mpi::communicator::~communicator((communicator *)0x1134d5);
  diy::mpi::environment::~environment((environment *)0x1134e2);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    // initialize MPI
    diy::mpi::environment  env(argc, argv);     // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator world;               // equivalent of MPI_COMM_WORLD

    int tot_blocks  = world.size();             // default number of global blocks
    int mem_blocks  = -1;                       // everything in core for now
    int num_threads = 1;                        // 1 thread for now
    int dom_dim     = 3;                        // domain dimensionality
    int nvals       = 100;                      // number of values per block

    // get command line arguments
    bool help;
    opts::Options ops;
    ops >> opts::Option('b', "tot_blocks",  tot_blocks, " total number of blocks")
        >> opts::Option('n', "nvals",       nvals,      " number of values per block")
        >> opts::Option('h', "help",        help,       " show help");

  if (!ops.parse(argc,argv) || help)
  {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // initialize DIY
    diy::FileStorage          storage("./DIY.XXXXXX"); // used for blocks to be moved out of core
    diy::Master               master(world,
                                     num_threads,
                                     mem_blocks,
                                     &Block::create,
                                     &Block::destroy,
                                     &storage,
                                     &Block::save,
                                     &Block::load);
    diy::ContiguousAssigner   assigner(world.size(), tot_blocks);

    // set global domain bounds
    Bounds dom_bounds(dom_dim);
    for (int i = 0; i < dom_dim; ++i)
    {
        dom_bounds.min[i] = -1.0;
        dom_bounds.max[i] =  1.0;
    }

    // decompose the domain into blocks
    Decomposer decomposer(dom_dim, dom_bounds, tot_blocks);
    decomposer.decompose(world.rank(),
                         assigner,
                         [&](int gid, const Bounds& core, const Bounds& bounds, const Bounds& domain, const RCLink& link)
                         { Block::add(gid, core, bounds, domain, link, master); });

    // initialize
    master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
            { b->init_data(cp, nvals); });

    // debug: print the blocks
    master.foreach(&Block::print_data);

    // save the results in diy format
    diy::io::write_blocks("test.out", world, master);

    // read the results back
    diy::Master read_master(world,
            1,
            -1,
            &Block::create,
            &Block::destroy);
    diy::ContiguousAssigner   read_assigner(world.size(), -1);   // number of blocks set by read_blocks()

    diy::io::read_blocks("test.out", world, read_assigner, read_master, &Block::load);
    fmt::print(stderr, "{} blocks read from file\n", read_master.size());

    // debug: print the blocks
    read_master.foreach(&Block::print_data);

    // compare
    master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
            { b->compare_data(cp, master, read_master); });
}